

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

char * __thiscall
fmt::v7::detail::utf8_to_utf16::utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *p)

{
  buffer<wchar_t> *this_00;
  runtime_error *this_01;
  wchar_t local_38;
  wchar_t local_34;
  wchar_t local_30 [4];
  int local_20;
  wchar_t local_1c;
  int error;
  uint32_t cp;
  char *p_local;
  anon_class_8_1_8991fb9c *this_local;
  
  this_00 = (buffer<wchar_t> *)this->this;
  local_1c = L'\0';
  local_20 = 0;
  _error = p;
  p_local = (char *)this;
  _error = utf8_decode(p,(uint32_t *)&local_1c,&local_20);
  if (local_20 != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"invalid utf8");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((uint)local_1c < 0x10000) {
    local_30[0] = local_1c;
    buffer<wchar_t>::push_back(this_00,local_30);
  }
  else {
    local_1c = local_1c + L'\xffff0000';
    local_34 = ((uint)local_1c >> 10) + L'\xd800';
    buffer<wchar_t>::push_back(this_00,&local_34);
    local_38 = (local_1c & 0x3ffU) + L'\xdc00';
    buffer<wchar_t>::push_back(this_00,&local_38);
  }
  return _error;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}